

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessage.hpp
# Opt level: O3

ssize_t __thiscall
cppassert::internal::PointerHelper<void>::write
          (PointerHelper<void> *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  
  poVar2 = this->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0x",2);
  lVar3 = *(long *)poVar2;
  poVar1 = poVar2 + *(long *)(lVar3 + -0x18);
  if (poVar2[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
    lVar3 = *(long *)poVar2;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 0x10;
  *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return (ssize_t)this->stream_;
}

Assistant:

std::ostream& write(void const *pointer) 
        {
            std::uintptr_t value = reinterpret_cast<std::uintptr_t>(pointer);
            (*stream_)<<"0x"
                <<std::setfill ('0') << std::setw(sizeof(void const *)*2)
                <<std::hex
                <<value;
                         
            return (*stream_);
        }